

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O0

JsonnetJsonValue * jsonnet_json_make_array(JsonnetVm *vm)

{
  JsonnetJsonValue *__s;
  JsonnetJsonValue *r;
  JsonnetJsonValue *in_stack_fffffffffffffff0;
  
  __s = (JsonnetJsonValue *)operator_new(0x78);
  memset(__s,0,0x78);
  JsonnetJsonValue::JsonnetJsonValue(in_stack_fffffffffffffff0);
  __s->kind = ARRAY;
  return __s;
}

Assistant:

JsonnetJsonValue *jsonnet_json_make_array(JsonnetVm *vm)
{
    (void)vm;
    JsonnetJsonValue *r = new JsonnetJsonValue();
    r->kind = JsonnetJsonValue::ARRAY;
    return r;
}